

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcToken * __thiscall CTcPrsGramNodeOr::get_next_token(CTcPrsGramNodeOr *this)

{
  byte bVar1;
  _func_int **pp_Var2;
  CTcPrsGramNode *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcToken *pCVar5;
  
  bVar1 = this->field_0x80;
  if ((bVar1 & 1) == 0) {
    pp_Var2 = (this->cur_alt_->super_CTcTokenSource)._vptr_CTcTokenSource;
    if ((bVar1 & 2) == 0) {
      iVar4 = (*pp_Var2[2])();
      pCVar5 = (CTcToken *)CONCAT44(extraout_var,iVar4);
    }
    else {
      iVar4 = (*pp_Var2[7])();
      pCVar5 = (CTcToken *)CONCAT44(extraout_var_02,iVar4);
      this->field_0x80 = this->field_0x80 & 0xfd;
    }
    if (pCVar5 != (CTcToken *)0x0) {
      return pCVar5;
    }
    if (this->cur_alt_->next_ != (CTcPrsGramNode *)0x0) {
      (this->or_tok_).typ_ = TOKT_OR;
      (this->or_tok_).text_ = "|";
      (this->or_tok_).text_len_ = 1;
      this->field_0x80 = this->field_0x80 | 1;
      return &this->or_tok_;
    }
  }
  else {
    this->field_0x80 = bVar1 & 0xfe;
    pCVar3 = this->cur_alt_->next_;
    this->cur_alt_ = pCVar3;
    if (pCVar3 != (CTcPrsGramNode *)0x0) {
      (*(pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource[8])();
      iVar4 = (*(this->cur_alt_->super_CTcTokenSource)._vptr_CTcTokenSource[7])();
      if (CONCAT44(extraout_var_00,iVar4) != 0) {
        iVar4 = (*(this->cur_alt_->super_CTcTokenSource)._vptr_CTcTokenSource[7])();
        return (CTcToken *)CONCAT44(extraout_var_01,iVar4);
      }
      this->field_0x80 = this->field_0x80 | 1;
      if (this->cur_alt_->next_ != (CTcPrsGramNode *)0x0) {
        return &this->or_tok_;
      }
      return (CTcToken *)0x0;
    }
  }
  return (CTcToken *)0x0;
}

Assistant:

const CTcToken *get_next_token()
    {
        const CTcToken *tok;

        /* 
         *   If we returned the synthesized '|' token between alternatives
         *   last time, advance to the next alternative and return its first
         *   token.  
         */
        if (just_did_or_)
        {
            /* we no longer just did an '|' */
            just_did_or_ = FALSE;
            
            /* advance to the next alternative */
            cur_alt_ = cur_alt_->next_;

            /* if there is no next alternative, there's nothing to return */
            if (cur_alt_ == 0)
                return 0;

            /* initialize the new alternative */
            cur_alt_->init_expansion();

            /* if this alternative has no subitems, return another '|' */
            if (cur_alt_->get_tok() == 0)
            {
                /* flag the '|' */
                just_did_or_ = TRUE;

                /* if this was the last alternative, we're done */
                if (cur_alt_->next_ == 0)
                    return 0;

                /* 
                 *   return the '|' again (we know it's already set up,
                 *   because we only get here if we did an '|' previously) 
                 */
                return &or_tok_;
            }

            /* return its current token */
            return cur_alt_->get_tok();
        }

        /*
         *   Get the first or next token in the current alternative,
         *   depending on where we are. 
         */
        if (before_first_)
        {
            /* we're before the first token - get the current token */
            tok = cur_alt_->get_tok();

            /* we're now past the first token */
            before_first_ = FALSE;
        }
        else
        {
            /* we're past the first token, so get the next one */
            tok = cur_alt_->get_next_token();
        }

        /* if we got a token from the current alternative, return it */
        if (tok != 0)
            return tok;

        /* 
         *   We've run out of tokens in this alternative - synthesize an OR
         *   token ('|') and return it, so the caller will know a new
         *   top-level alternative follows.
         *   
         *   Do NOT synthesize an OR token after our last alternative.  
         */
        if (cur_alt_->next_ == 0)
        {
            /* this was our last alternative - we're done */
            return 0;
        }

        /* we have another alternative - synthesize an OR */
        or_tok_.settyp(TOKT_OR);
        or_tok_.set_text("|", 1);

        /* flag that we just did an '|' */
        just_did_or_ = TRUE;

        /* return the synthesized '|' token */
        return &or_tok_;
    }